

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerUtil.cpp
# Opt level: O2

ByteString * DERUTIL::raw2Octet(ByteString *__return_storage_ptr__,ByteString *byteString)

{
  size_t sVar1;
  uchar *puVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  size_t pos;
  ByteString header;
  
  ByteString::ByteString(&header);
  sVar1 = ByteString::size(byteString);
  if (sVar1 < 0x80) {
    ByteString::resize(&header,2);
    puVar2 = ByteString::operator[](&header,0);
    *puVar2 = '\x04';
    puVar2 = ByteString::operator[](&header,1);
    *puVar2 = (uchar)sVar1;
  }
  else {
    lVar3 = 8;
    for (bVar5 = 0x38; (lVar3 != 0 && ((char)(sVar1 >> (bVar5 & 0x3f)) == '\0')); bVar5 = bVar5 - 8)
    {
      lVar3 = lVar3 + -1;
    }
    ByteString::resize(&header,lVar3 + 2);
    puVar2 = ByteString::operator[](&header,0);
    *puVar2 = '\x04';
    pbVar4 = ByteString::operator[](&header,1);
    *pbVar4 = (byte)lVar3 | 0x80;
    for (pos = lVar3 + 1; pos != 1; pos = pos - 1) {
      puVar2 = ByteString::operator[](&header,pos);
      *puVar2 = (uchar)sVar1;
      sVar1 = sVar1 >> 8;
    }
  }
  operator+(__return_storage_ptr__,&header,byteString);
  ByteString::~ByteString(&header);
  return __return_storage_ptr__;
}

Assistant:

ByteString DERUTIL::raw2Octet(const ByteString& byteString)
{
	ByteString header;
	size_t len = byteString.size();

	// Definite, short
	if (len < 0x80)
 	{
		header.resize(2);
		header[0] = (unsigned char)0x04;
		header[1] = (unsigned char)(len & 0x7F);
	}
	// Definite, long
	else
	{
		// Count significate bytes
		size_t bytes = sizeof(size_t);
		for(; bytes > 0; bytes--)
		{
			size_t value = len >> ((bytes - 1) * 8);
			if (value & 0xFF) break;
		}

		// Set header data
		header.resize(2 + bytes);
		header[0] = (unsigned char)0x04;
		header[1] = (unsigned char)(0x80 | bytes);
		for (size_t i = 1; i <= bytes; i++)
		{
			header[2+bytes-i] = (unsigned char) (len & 0xFF);
			len >>= 8;
		}
	}

	return header + byteString;
}